

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int arg_int_scanfn(arg_int *parent,char *argval)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  char *end;
  char *local_30;
  
  if (parent->count == (parent->hdr).maxcount) {
    return 2;
  }
  if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
    return 0;
  }
  lVar3 = strtol0X(argval,&local_30,'X',0x10);
  if ((((local_30 == argval) && (lVar3 = strtol0X(argval,&local_30,'O',8), local_30 == argval)) &&
      (lVar3 = strtol0X(argval,&local_30,'B',2), local_30 == argval)) &&
     (lVar3 = strtol(argval,&local_30,10), local_30 == argval)) {
    return 3;
  }
  iVar5 = (uint)((int)lVar3 != lVar3) << 2;
  iVar1 = detectsuffix(local_30,"KB");
  if (iVar1 == 0) {
    iVar1 = detectsuffix(local_30,"MB");
    if (iVar1 == 0) {
      iVar1 = detectsuffix(local_30,"GB");
      if (iVar1 == 0) {
        iVar2 = detectsuffix(local_30,"");
        iVar1 = iVar5;
        if (iVar2 == 0) {
          iVar1 = 3;
        }
        goto LAB_00123440;
      }
      lVar4 = lVar3 << 0x1e;
      bVar6 = lVar3 - 2U < 0xfffffffffffffffc;
    }
    else {
      lVar4 = lVar3 << 0x14;
      bVar6 = lVar3 - 0x800U < 0xfffffffffffff000;
    }
  }
  else {
    lVar4 = lVar3 << 10;
    bVar6 = lVar3 - 0x200000U < 0xffffffffffc00000;
  }
  iVar1 = 4;
  if (!bVar6) {
    lVar3 = lVar4;
    iVar1 = iVar5;
  }
LAB_00123440:
  if (iVar1 == 0) {
    iVar5 = parent->count;
    parent->count = iVar5 + 1;
    parent->ival[iVar5] = (int)lVar3;
  }
  return iVar1;
}

Assistant:

static int arg_int_scanfn(struct arg_int* parent, const char* argval) {
    int errorcode = 0;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent arguiment value unaltered but still count the argument. */
        parent->count++;
    } else {
        long int val;
        const char* end;

        /* attempt to extract hex integer (eg: +0x123) from argval into val conversion */
        val = strtol0X(argval, &end, 'X', 16);
        if (end == argval) {
            /* hex failed, attempt octal conversion (eg +0o123) */
            val = strtol0X(argval, &end, 'O', 8);
            if (end == argval) {
                /* octal failed, attempt binary conversion (eg +0B101) */
                val = strtol0X(argval, &end, 'B', 2);
                if (end == argval) {
                    /* binary failed, attempt decimal conversion with no prefix (eg 1234) */
                    val = strtol(argval, (char**)&end, 10);
                    if (end == argval) {
                        /* all supported number formats failed */
                        return ARG_ERR_BADINT;
                    }
                }
            }
        }

        /* Safety check for integer overflow. WARNING: this check    */
        /* achieves nothing on machines where size(int)==size(long). */
        if (val > INT_MAX || val < INT_MIN)
            errorcode = ARG_ERR_OVERFLOW;

        /* Detect any suffixes (KB,MB,GB) and multiply argument value appropriately. */
        /* We need to be mindful of integer overflows when using such big numbers.   */
        if (detectsuffix(end, "KB")) /* kilobytes */
        {
            if (val > (INT_MAX / 1024) || val < (INT_MIN / 1024))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1024;                /* 1KB = 1024 */
        } else if (detectsuffix(end, "MB")) /* megabytes */
        {
            if (val > (INT_MAX / 1048576) || val < (INT_MIN / 1048576))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1048576;             /* 1MB = 1024*1024 */
        } else if (detectsuffix(end, "GB")) /* gigabytes */
        {
            if (val > (INT_MAX / 1073741824) || val < (INT_MIN / 1073741824))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1073741824; /* 1GB = 1024*1024*1024 */
        } else if (!detectsuffix(end, ""))
            errorcode = ARG_ERR_BADINT; /* invalid suffix detected */

        /* if success then store result in parent->ival[] array */
        if (errorcode == 0)
            parent->ival[parent->count++] = (int)val;
    }

    /* printf("%s:scanfn(%p,%p) returns %d\n",__FILE__,parent,argval,errorcode); */
    return errorcode;
}